

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_ddot(int n,double *x,int incx,double *y,int incy,double *alpha)

{
  uint uVar1;
  char *__assertion;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  
  if (x == (double *)0x0) {
    __assertion = "x";
    uVar1 = 0x6f;
  }
  else {
    if (y != (double *)0x0) {
      *alpha = 0.0;
      uVar1 = 0;
      if (0 < n) {
        uVar1 = n;
      }
      uVar2 = (ulong)uVar1;
      dVar4 = 0.0;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        dVar4 = dVar4 + *x * *y;
        *alpha = dVar4;
        x = x + incx;
        y = y + incy;
      }
      return;
    }
    __assertion = "y";
    uVar1 = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,uVar1,"void la_ddot(int, double *, int, double *, int, double *)");
}

Assistant:

void la_ddot(
        int n,
        double *x, int incx,
        double *y, int incy,
        double *alpha)
{
    assert(x);
    assert(y);

    *alpha = 0.0;
    for (int i = 0; i < n; i++) {
        *alpha += x[i * incx] * y[i * incy];
    }
}